

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 ArchiveHashGrowTable(SyArchive *pArch)

{
  sxu32 sVar1;
  SyArchiveEntry **apTable;
  uint local_34;
  SyArchiveEntry *pSStack_30;
  sxu32 n;
  SyArchiveEntry *pEntry;
  SyArchiveEntry **apNew;
  sxu32 nNewSize;
  SyArchive *pArch_local;
  
  sVar1 = pArch->nSize;
  apTable = (SyArchiveEntry **)SyMemBackendAlloc(pArch->pAllocator,sVar1 << 4);
  if (apTable != (SyArchiveEntry **)0x0) {
    SyZero(apTable,sVar1 << 4);
    local_34 = 0;
    pSStack_30 = pArch->pList;
    for (; local_34 < pArch->nLoaded; local_34 = local_34 + 1) {
      pSStack_30->pPrevHash = (SyArchiveEntry *)0x0;
      pSStack_30->pNextHash = (SyArchiveEntry *)0x0;
      ArchiveHashBucketInstall(apTable,pSStack_30->nHash & sVar1 * 2 - 1,pSStack_30);
      pSStack_30 = pSStack_30->pNext;
    }
    SyMemBackendFree(pArch->pAllocator,pArch->apHash);
    pArch->apHash = apTable;
    pArch->nSize = sVar1 * 2;
  }
  return 0;
}

Assistant:

static sxi32 ArchiveHashGrowTable(SyArchive *pArch)
{
	sxu32 nNewSize = pArch->nSize * 2;
	SyArchiveEntry **apNew;
	SyArchiveEntry *pEntry;
	sxu32 n;

	/* Allocate a new table */
	apNew = (SyArchiveEntry **)SyMemBackendAlloc(pArch->pAllocator, nNewSize * sizeof(SyArchiveEntry *));
	if( apNew == 0 ){
		return SXRET_OK; /* Not so fatal, simply a performance hit */
	}
	SyZero(apNew, nNewSize * sizeof(SyArchiveEntry *));
	/* Rehash old entries */
	for( n = 0 , pEntry = pArch->pList ; n < pArch->nLoaded ; n++ , pEntry = pEntry->pNext ){
		pEntry->pNextHash = pEntry->pPrevHash = 0;
		ArchiveHashBucketInstall(apNew, pEntry->nHash & (nNewSize - 1), pEntry);
	}
	/* Release the old table */
	SyMemBackendFree(pArch->pAllocator, pArch->apHash);
	pArch->apHash = apNew;
	pArch->nSize = nNewSize;

	return SXRET_OK;
}